

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void av1_txfm_rd_in_plane
               (MACROBLOCK *x,AV1_COMP *cpi,RD_STATS *rd_stats,int64_t ref_best_rd,
               int64_t current_rd,int plane,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               FAST_TX_SEARCH_MODE ftxs_mode,int skip_trellis)

{
  int iVar1;
  long in_RCX;
  RD_STATS *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int invalid_rd;
  int is_inter;
  MB_MODE_INFO *mbmi;
  rdcost_block_args args;
  macroblockd_plane *pd;
  MACROBLOCKD *xd;
  ENTROPY_CONTEXT *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  BLOCK_SIZE plane_bsize_00;
  long local_d8;
  long local_d0;
  void *in_stack_ffffffffffffff58;
  foreach_transformed_block_visitor in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  BLOCK_SIZE in_stack_ffffffffffffff6f;
  MACROBLOCKD *in_stack_ffffffffffffff70;
  RD_STATS RStack_88;
  long local_60;
  long local_58;
  int local_50;
  int local_4c;
  long local_40;
  long local_38;
  long local_28;
  long local_20;
  RD_STATS *local_18;
  long local_10;
  long local_8;
  
  plane_bsize_00 = (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff20 >> 0x38);
  if (((*(byte *)(in_RSI + 0x426f0) & 1) == 0) && (""[(byte)invalid_rd] == '\x04')) {
    av1_invalid_rd_stats(in_RDX);
  }
  else if (in_RCX < in_R8) {
    av1_invalid_rd_stats(in_RDX);
  }
  else {
    local_38 = in_RDI + 0x1a0;
    local_40 = in_RDI + 0x1b0 + (long)in_R9D * 0xa30;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    memset(&local_d8,0,0x98);
    local_d0 = local_8;
    local_d8 = local_10;
    local_58 = local_20;
    local_60 = local_28;
    av1_init_rd_stats(&RStack_88);
    av1_get_entropy_contexts
              (plane_bsize_00,
               (macroblockd_plane *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (ENTROPY_CONTEXT *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    av1_foreach_transformed_block_in_plane
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    iVar1 = is_inter_block((MB_MODE_INFO *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    if (iVar1 != 0) {
      local_50 = local_4c;
    }
    if (local_50 == 0) {
      memcpy(local_18,&RStack_88,0x28);
    }
    else {
      av1_invalid_rd_stats(local_18);
    }
  }
  return;
}

Assistant:

void av1_txfm_rd_in_plane(MACROBLOCK *x, const AV1_COMP *cpi,
                          RD_STATS *rd_stats, int64_t ref_best_rd,
                          int64_t current_rd, int plane, BLOCK_SIZE plane_bsize,
                          TX_SIZE tx_size, FAST_TX_SEARCH_MODE ftxs_mode,
                          int skip_trellis) {
  assert(IMPLIES(plane == 0, x->e_mbd.mi[0]->tx_size == tx_size));

  if (!cpi->oxcf.txfm_cfg.enable_tx64 &&
      txsize_sqr_up_map[tx_size] == TX_64X64) {
    av1_invalid_rd_stats(rd_stats);
    return;
  }

  if (current_rd > ref_best_rd) {
    av1_invalid_rd_stats(rd_stats);
    return;
  }

  MACROBLOCKD *const xd = &x->e_mbd;
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  struct rdcost_block_args args;
  av1_zero(args);
  args.x = x;
  args.cpi = cpi;
  args.best_rd = ref_best_rd;
  args.current_rd = current_rd;
  args.ftxs_mode = ftxs_mode;
  args.skip_trellis = skip_trellis;
  av1_init_rd_stats(&args.rd_stats);

  av1_get_entropy_contexts(plane_bsize, pd, args.t_above, args.t_left);
  av1_foreach_transformed_block_in_plane(xd, plane_bsize, plane, block_rd_txfm,
                                         &args);

  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int is_inter = is_inter_block(mbmi);
  const int invalid_rd = is_inter ? args.incomplete_exit : args.exit_early;

  if (invalid_rd) {
    av1_invalid_rd_stats(rd_stats);
  } else {
    *rd_stats = args.rd_stats;
  }
}